

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ColorEqual
          (ComputeShaderBase *this,vec3 *c0,vec3 *c1,vec4 *epsilon)

{
  float fVar1;
  float fVar2;
  
  fVar1 = *(float *)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper - c0->m_data[0];
  fVar2 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar2 = fVar1;
  }
  if (fVar2 < c1->m_data[0] || fVar2 == c1->m_data[0]) {
    fVar1 = *(float *)((long)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper + 4) -
            c0->m_data[1];
    fVar2 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar2 = fVar1;
    }
    if (fVar2 < c1->m_data[1] || fVar2 == c1->m_data[1]) {
      fVar1 = *(float *)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl -
              c0->m_data[2];
      fVar2 = -fVar1;
      if (-fVar1 <= fVar1) {
        fVar2 = fVar1;
      }
      return fVar2 < c1->m_data[2] || fVar2 == c1->m_data[2];
    }
  }
  return false;
}

Assistant:

T						x			(void) const { return m_data[0]; }